

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  undefined7 extraout_var;
  ImGuiCol idx;
  uint uVar7;
  undefined1 auVar8 [12];
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001244 [12];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  undefined1 auVar19 [12];
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  bool held;
  bool hovered;
  bool local_de;
  bool local_dd;
  float local_dc;
  ImRect local_d8;
  ImDrawCornerFlags local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ulong local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  undefined1 auVar12 [16];
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    uStack_b4 = in_register_00001244._0_4_;
    uStack_b0 = in_register_00001244._4_4_;
    uStack_ac = in_register_00001244._8_4_;
    fVar23 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar24 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar23 <= 0.0) {
      return false;
    }
    if (fVar24 <= 0.0) {
      return false;
    }
    local_dc = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar14 = (GImGui->Style).FramePadding.y;
      fVar14 = fVar14 + fVar14;
      if (fVar24 < fVar14 + GImGui->FontSize) {
        fVar14 = (fVar24 - GImGui->FontSize) / fVar14;
        local_dc = 1.0;
        if (fVar14 <= 1.0) {
          local_dc = fVar14;
        }
        local_dc = (float)(~-(uint)(fVar14 < 0.0) & (uint)local_dc);
      }
    }
    if (0.0 < local_dc) {
      iVar18 = (int)((fVar23 + -2.0) * 0.5);
      iVar21 = (int)((fVar24 + -2.0) * 0.5);
      auVar16._0_4_ = -(uint)(iVar18 < 0);
      auVar16._4_4_ = -(uint)(iVar21 < 0);
      auVar16._8_8_ = 0;
      auVar20._0_4_ = -(uint)(3 < iVar18);
      auVar20._4_4_ = -(uint)(3 < iVar21);
      auVar20._8_8_ = 0;
      auVar15._0_8_ = CONCAT44((float)iVar21,(float)iVar18) ^ 0x8000000080000000;
      auVar15._8_4_ = 0x80000000;
      auVar15._12_4_ = 0x80000000;
      auVar17 = auVar16 & _DAT_001a7540 | ~auVar16 & (auVar20 & _DAT_001a7530 | ~auVar20 & auVar15);
      fStack_90 = auVar17._0_4_;
      fVar24 = auVar17._4_4_;
      auVar17._8_4_ = fStack_90;
      auVar17._12_4_ = fVar24;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_98 = local_d8.Min.x - fStack_90;
      fVar23 = local_d8.Min.y - fVar24;
      fStack_90 = local_d8.Max.x + fStack_90;
      fStack_94 = local_d8.Max.y + fVar24;
      auVar3._4_8_ = auVar17._8_8_;
      auVar3._0_4_ = local_d8.Min.y + fVar24;
      auVar11._0_8_ = auVar3._0_8_ << 0x20;
      auVar11._8_4_ = fStack_90;
      auVar11._12_4_ = fStack_94;
      local_d8.Max = auVar11._8_8_;
      local_d8.Min.y = fVar23;
      local_d8.Min.x = local_98;
      if (axis != ImGuiAxis_X) {
        local_98 = fVar23;
        fStack_90 = fStack_94;
      }
      local_98 = fStack_90 - local_98;
      fVar23 = (float)(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v |
                      -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v);
      local_bc = rounding_corners;
      local_b8 = size_contents_v;
      if (0.0 < fVar23) {
        if (fVar23 <= 1.0) {
          fVar23 = 1.0;
        }
        fVar14 = (size_avail_v / fVar23) * local_98;
        fVar23 = (GImGui->Style).GrabMinSize;
        fVar24 = local_98;
        if (fVar14 <= local_98) {
          fVar24 = fVar14;
        }
        uVar7 = -(uint)(fVar14 < fVar23);
        uStack_84 = ~in_XMM0_Db & (uint)fStack_94;
        uStack_80 = ~in_XMM0_Dc & (uint)fStack_90;
        uStack_7c = ~in_XMM0_Dd & (uint)fStack_94;
        local_88 = (float)(uVar7 & (uint)fVar23 | ~uVar7 & (uint)fVar24);
        local_de = false;
        local_dd = false;
        local_a8._4_4_ = in_XMM0_Db;
        local_a8._0_4_ = size_avail_v;
        local_a8._8_4_ = in_XMM0_Dc;
        local_a8._12_4_ = in_XMM0_Dd;
        fStack_8c = fStack_94;
        bVar6 = ButtonBehavior(&local_d8,id,&local_dd,&local_de,0x4000);
        auVar4._4_4_ = fStack_94;
        auVar4._0_4_ = local_98;
        auVar4._8_4_ = fStack_90;
        auVar4._12_4_ = fStack_8c;
        fVar23 = 1.0;
        if (1.0 <= local_b8 - (float)local_a8._0_4_) {
          fVar23 = local_b8 - (float)local_a8._0_4_;
        }
        auVar22._4_4_ = *p_scroll_v;
        auVar22._0_4_ = local_88;
        auVar22._8_4_ = uStack_84;
        auVar22._12_4_ = 0;
        auVar9._4_4_ = fVar23;
        auVar9._0_4_ = local_98;
        auVar9._8_4_ = fStack_94;
        auVar9._12_4_ = 0;
        auVar17 = divps(auVar22,auVar9);
        fVar14 = auVar17._4_4_;
        iVar18 = -(uint)(auVar17._0_4_ < 1.0);
        iVar21 = -(uint)(fVar14 < 0.0);
        auVar13._4_4_ = iVar21;
        auVar13._0_4_ = iVar18;
        auVar13._8_4_ = iVar21;
        auVar13._12_4_ = iVar21;
        auVar12._8_8_ = auVar13._8_8_;
        auVar12._4_4_ = iVar18;
        auVar12._0_4_ = iVar18;
        uVar7 = movmskpd((int)CONCAT71(extraout_var,bVar6),auVar12);
        fVar24 = 0.0;
        if (((uVar7 & 2) == 0) && (fVar24 = 1.0, fVar14 <= 1.0)) {
          fVar24 = fVar14;
        }
        auVar10._4_12_ = auVar4._4_12_;
        auVar10._0_4_ = local_98 - local_88;
        local_b8 = (fVar24 * auVar10._0_4_) / local_98;
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        if (((1.0 <= local_dc) && ((uVar7 & 1) != 0)) && (local_de != false)) {
          local_58 = (ulong)(uint)fVar23;
          uStack_50 = 0;
          local_a8 = auVar17;
          local_68 = auVar10;
          if (1 < (uint)axis) {
            __assert_fail("idx <= 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                          ,0xd6,"float &ImVec2::operator[](size_t)");
          }
          fVar23 = (*(float *)((pIVar5->IO).MouseDown + (ulong)(uint)axis * 4 + -8) -
                   (&local_d8.Min.x)[(uint)axis]) / local_98;
          auVar8 = ZEXT812(0x3f800000);
          if (fVar23 <= 1.0) {
            auVar8._4_8_ = 0;
            auVar8._0_4_ = fVar23;
          }
          local_78._0_4_ = ~-(uint)(fVar23 < 0.0) & auVar8._0_4_;
          local_78._4_4_ = 0;
          local_78._8_4_ = auVar8._8_4_;
          local_78._12_4_ = 0;
          SetHoveredID(id);
          if (pIVar5->ActiveIdIsJustActivated == true) {
            bVar2 = (float)local_a8._0_4_ + local_b8 < (float)local_78._0_4_;
            bVar6 = bVar2 || (float)local_78._0_4_ < local_b8;
            fVar23 = 0.0;
            if (!bVar2 && (float)local_78._0_4_ >= local_b8) {
              fVar23 = (float)local_a8._0_4_ * -0.5 + ((float)local_78._0_4_ - local_b8);
            }
            pIVar5->ScrollbarClickDeltaToGrabCenter = fVar23;
          }
          else {
            bVar6 = false;
          }
          auVar19 = ZEXT812(0x3f800000);
          fVar24 = (((float)local_78._0_4_ - pIVar5->ScrollbarClickDeltaToGrabCenter) -
                   (float)local_a8._0_4_ * 0.5) / (1.0 - (float)local_a8._0_4_);
          fVar23 = 1.0;
          if (fVar24 <= 1.0) {
            fVar23 = fVar24;
          }
          fVar23 = (float)(int)((float)(~-(uint)(fVar24 < 0.0) & (uint)fVar23) * (float)local_58 +
                               0.5);
          *p_scroll_v = fVar23;
          fVar23 = fVar23 / (float)local_58;
          if (fVar23 <= auVar19._0_4_) {
            auVar19._4_8_ = auVar19._4_8_;
            auVar19._0_4_ = fVar23;
          }
          uStack_b4 = local_68._4_4_;
          uStack_b0 = local_68._8_4_;
          uStack_ac = local_68._12_4_;
          local_b8 = (local_68._0_4_ * (float)(~-(uint)(fVar23 < 0.0) & auVar19._0_4_)) / local_98;
          if (bVar6) {
            pIVar5->ScrollbarClickDeltaToGrabCenter =
                 -(float)local_a8._0_4_ * 0.5 + ((float)local_78._0_4_ - local_b8);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (local_de == false) {
          idx = (local_dd & 1) + 0xf;
        }
        local_dc = (float)GetColorU32(idx,local_dc);
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,
                   local_bc);
        if (axis == ImGuiAxis_X) {
          local_48.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_b8;
          aIStack_40[0].x = local_88 + local_48.x;
          aIStack_40[0].y = local_d8.Max.y;
          local_48.y = local_d8.Min.y;
        }
        else {
          local_48.y = (local_d8.Max.y - local_d8.Min.y) * local_b8 + local_d8.Min.y;
          aIStack_40[0].x = local_d8.Max.x;
          aIStack_40[0].y = local_88 + local_48.y;
          local_48.x = local_d8.Min.x;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&local_48,aIStack_40,(ImU32)local_dc,
                   (pIVar5->Style).ScrollbarRounding,0xf);
        return local_de;
      }
      __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x382,
                    "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                   );
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}